

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O3

aiScene * __thiscall Assimp::BatchLoader::GetImport(BatchLoader *this,uint which)

{
  int *piVar1;
  aiScene *paVar2;
  iterator __position;
  
  __position._M_node =
       (this->m_data->requests).
       super__List_base<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>._M_impl._M_node.
       super__List_node_base._M_next;
  while( true ) {
    if (__position._M_node == (_List_node_base *)&this->m_data->requests) {
      return (aiScene *)0x0;
    }
    if ((*(uint *)&__position._M_node[0x10]._M_prev == which) &&
       (*(char *)&__position._M_node[4]._M_next == '\x01')) break;
    __position._M_node = (__position._M_node)->_M_next;
  }
  paVar2 = (aiScene *)__position._M_node[3]._M_prev;
  piVar1 = (int *)((long)&__position._M_node[3]._M_next + 4);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return paVar2;
  }
  std::__cxx11::list<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::_M_erase
            (&this->m_data->requests,__position);
  return paVar2;
}

Assistant:

aiScene* BatchLoader::GetImport( unsigned int which )
{
    for ( LoadReqIt it = m_data->requests.begin();it != m_data->requests.end(); ++it) {
        if ((*it).id == which && (*it).loaded)  {
            aiScene* sc = (*it).scene;
            if (!(--(*it).refCnt))  {
                m_data->requests.erase(it);
            }
            return sc;
        }
    }
    return nullptr;
}